

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O1

uchar * __thiscall CVmRun::do_throw(CVmRun *this,uchar *pc,vm_obj_id_t exception_obj)

{
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  uchar *puVar3;
  int iVar4;
  ushort *puVar5;
  CVmRun *this_00;
  ulong uVar6;
  uint uVar7;
  uchar *unaff_R14;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  
  do {
    puVar3 = entry_ptr_native_;
    this_00 = (CVmRun *)entry_ptr_native_;
    if ((entry_ptr_native_ == (uchar *)0x0) || ((ulong)*(ushort *)(entry_ptr_native_ + 6) == 0)) {
LAB_001ee401:
      if (frame_ptr_ == (vm_val_t *)0x0) {
        unaff_R14 = (uchar *)0x0;
        goto LAB_001ee429;
      }
      pc = do_return(this_00);
      bVar9 = pc != (uchar *)0x0;
      if (!bVar9) {
        unaff_R14 = (uchar *)0x0;
      }
    }
    else {
      uVar6 = (ulong)*(ushort *)(entry_ptr_native_ + *(ushort *)(entry_ptr_native_ + 6));
      bVar9 = uVar6 != 0;
      if (bVar9) {
        uVar7 = (int)pc - (int)entry_ptr_native_;
        puVar5 = (ushort *)((long)(entry_ptr_native_ + *(ushort *)(entry_ptr_native_ + 6)) + 2);
        uVar8 = 1;
        do {
          if ((*puVar5 <= uVar7) && (uVar7 <= puVar5[1])) {
            if ((*(vm_obj_id_t *)(puVar5 + 2) != 0) &&
               (*(vm_obj_id_t *)(puVar5 + 2) != exception_obj)) {
              this_00 = (CVmRun *)
                        (G_obj_table_X.pages_[exception_obj >> 0xc] + (exception_obj & 0xfff));
              iVar4 = (**(code **)(*(long *)&this_00->super_CVmStack + 0x38))();
              if (iVar4 == 0) goto LAB_001ee39f;
            }
            pvVar2 = sp_;
            pc = puVar3 + puVar5[4];
            pvVar1 = &sp_->typ;
            sp_ = sp_ + 1;
            *pvVar1 = VM_OBJ;
            (pvVar2->val).obj = exception_obj;
            unaff_R14 = pc;
            break;
          }
LAB_001ee39f:
          puVar5 = (ushort *)((long)puVar5 + G_exc_entry_size_X);
          bVar9 = uVar8 < uVar6;
          bVar10 = uVar8 != uVar6;
          uVar8 = uVar8 + 1;
        } while (bVar10);
      }
      if (!bVar9) goto LAB_001ee401;
LAB_001ee429:
      bVar9 = false;
    }
    if (!bVar9) {
      return unaff_R14;
    }
  } while( true );
}

Assistant:

const uchar *CVmRun::do_throw(VMG_ const uchar *pc, vm_obj_id_t exception_obj)
{
    /*
     *   Search the stack for a handler for this exception class.  Start
     *   at the current stack frame; if we find a handler here, use it;
     *   otherwise, unwind the stack to the enclosing frame and search for
     *   a handler there; repeat until we exhaust the stack.  
     */
    for (;;)
    {
        CVmExcTablePtr tab;
        const uchar *func_start;
        uint ofs;

        /* get a pointer to the start of the current function */
        func_start = entry_ptr_native_;

        /* set up a pointer to the current exception table */
        if (func_start != 0 && tab.set(func_start))
        {
            size_t cnt;
            size_t i;
            CVmExcEntryPtr entry;

            /* calculate our offset in the current function */
            ofs = pc - func_start;

            /* set up a pointer to the first table entry */
            tab.set_entry_ptr(vmg_ &entry, 0);
            
            /* loop through the entries */
            for (i = 0, cnt = tab.get_count() ; i < cnt ;
                 ++i, entry.inc(vmg0_))
            {
                /* 
                 *   Check to see if we're in the range for this entry.
                 *   If this entry covers the appropriate range, and the
                 *   exception we're handling is of the class handled by
                 *   this exception (or derives from that class), this
                 *   handler handles this exception. 
                 */
                if (ofs >= entry.get_start_ofs()
                    && ofs <= entry.get_end_ofs()
                    && (entry.get_exception() == VM_INVALID_OBJ
                        || exception_obj == entry.get_exception()
                        || (vm_objp(vmg_ exception_obj)
                            ->is_instance_of(vmg_ entry.get_exception()))))
                {
                    /* 
                     *   this is it - move the program counter to the
                     *   first byte of the handler's code 
                     */
                    pc = func_start + entry.get_handler_ofs();

                    /* push the exception so that the handler can get at it */
                    push_obj(vmg_ exception_obj);

                    /* return the new program counter at which to resume */
                    return pc;
                }
            }
        }

        /* 
         *   We didn't find a handler in the current function - unwind the
         *   stack one level, using an ordinary RETURN operation (we're not
         *   really returning, though, so we don't need to provide a return
         *   value).  First, though, check to make sure there is an enclosing
         *   frame at all - if there's not, we can simply return immediately.
         */
        if (frame_ptr_ == 0)
        {
            /* there's no enclosing frame, so there's nowhere to go */
            return 0;
        }

        /* try unwinding the stack a level */
        if ((pc = do_return(vmg0_)) == 0)
        {
            /* 
             *   The enclosing frame is a recursive invocation, so we cannot
             *   unwind any further at this point.  Return null to indicate
             *   that the exception was not handled and should be thrown out
             *   of the current recursive VM invocation.  
             */
            return 0;
        }
    }
}